

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseHash(Parser *this,Value *e,FieldDef *field)

{
  unsigned_short uVar1;
  uint uVar2;
  Value *pVVar3;
  HashFunction p_Var4;
  HashFunction p_Var5;
  HashFunction p_Var6;
  unsigned_long uVar7;
  long in_RCX;
  allocator<char> local_49;
  string local_48;
  
  if (in_RCX != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"hash",&local_49);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                       ((SymbolTable<flatbuffers::Value> *)(in_RCX + 0x58),&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    switch(*(undefined4 *)&(field->super_Definition).name._M_dataplus._M_p) {
    case 5:
      p_Var5 = FindHashFunction16((pVVar3->constant)._M_dataplus._M_p);
      uVar1 = (*p_Var5)((char *)(e->constant)._M_string_length);
      NumToString<short>(&local_48,uVar1);
      break;
    case 6:
      p_Var5 = FindHashFunction16((pVVar3->constant)._M_dataplus._M_p);
      uVar1 = (*p_Var5)((char *)(e->constant)._M_string_length);
      NumToString<unsigned_short>(&local_48,uVar1);
      break;
    case 7:
      p_Var4 = FindHashFunction32((pVVar3->constant)._M_dataplus._M_p);
      uVar2 = (*p_Var4)((char *)(e->constant)._M_string_length);
      NumToString<int>(&local_48,uVar2);
      break;
    case 8:
      p_Var4 = FindHashFunction32((pVVar3->constant)._M_dataplus._M_p);
      uVar2 = (*p_Var4)((char *)(e->constant)._M_string_length);
      NumToString<unsigned_int>(&local_48,uVar2);
      break;
    case 9:
      p_Var6 = FindHashFunction64((pVVar3->constant)._M_dataplus._M_p);
      uVar7 = (*p_Var6)((char *)(e->constant)._M_string_length);
      NumToString<long>(&local_48,uVar7);
      break;
    case 10:
      p_Var6 = FindHashFunction64((pVVar3->constant)._M_dataplus._M_p);
      uVar7 = (*p_Var6)((char *)(e->constant)._M_string_length);
      NumToString<unsigned_long>(&local_48,uVar7);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x7dd,"CheckedError flatbuffers::Parser::ParseHash(Value &, FieldDef *)");
    }
    std::__cxx11::string::operator=((string *)&(field->super_Definition).file,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
    return SUB82(this,0);
  }
  __assert_fail("field",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0x7b6,"CheckedError flatbuffers::Parser::ParseHash(Value &, FieldDef *)");
}

Assistant:

CheckedError Parser::ParseHash(Value &e, FieldDef *field) {
  FLATBUFFERS_ASSERT(field);
  Value *hash_name = field->attributes.Lookup("hash");
  switch (e.type.base_type) {
    case BASE_TYPE_SHORT: {
      auto hash = FindHashFunction16(hash_name->constant.c_str());
      int16_t hashed_value = static_cast<int16_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_USHORT: {
      auto hash = FindHashFunction16(hash_name->constant.c_str());
      uint16_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_INT: {
      auto hash = FindHashFunction32(hash_name->constant.c_str());
      int32_t hashed_value = static_cast<int32_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_UINT: {
      auto hash = FindHashFunction32(hash_name->constant.c_str());
      uint32_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_LONG: {
      auto hash = FindHashFunction64(hash_name->constant.c_str());
      int64_t hashed_value = static_cast<int64_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_ULONG: {
      auto hash = FindHashFunction64(hash_name->constant.c_str());
      uint64_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    default: FLATBUFFERS_ASSERT(0);
  }
  NEXT();
  return NoError();
}